

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_async_function_resolve_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,int flags
                  )

{
  JSAsyncFunctionData *s;
  JSValue *pJVar1;
  int iVar2;
  ulong uVar3;
  int64_t iVar4;
  ulong uVar5;
  int *piVar6;
  JSValue obj;
  
  s = *(JSAsyncFunctionData **)((long)func_obj.u.ptr + 0x30);
  iVar2 = *(ushort *)((long)func_obj.u.ptr + 6) - 0x2e;
  if (argc < 1) {
    iVar4 = 3;
    uVar3 = 0;
    uVar5 = 0;
  }
  else {
    iVar4 = argv->tag;
    uVar5 = (ulong)(argv->u).ptr & 0xffffffff00000000;
    uVar3 = (ulong)(argv->u).ptr & 0xffffffff;
  }
  (s->func_state).throw_flag = iVar2;
  if (iVar2 == 0) {
    pJVar1 = (s->func_state).frame.cur_sp;
    piVar6 = (int *)(uVar5 | uVar3);
    if (0xfffffff4 < (uint)iVar4) {
      *piVar6 = *piVar6 + 1;
    }
    pJVar1[-1].u.ptr = piVar6;
    pJVar1[-1].tag = iVar4;
  }
  else {
    obj.u.ptr = (void *)(uVar5 | uVar3);
    if (0xfffffff4 < (uint)iVar4) {
      *(int *)obj.u.ptr = *obj.u.ptr + 1;
    }
    obj.tag = iVar4;
    JS_Throw(ctx,obj);
  }
  js_async_function_resume(ctx,s);
  return (JSValue)(ZEXT816(3) << 0x40);
}

Assistant:

static JSValue js_async_function_resolve_call(JSContext *ctx,
                                              JSValueConst func_obj,
                                              JSValueConst this_obj,
                                              int argc, JSValueConst *argv,
                                              int flags)
{
    JSObject *p = JS_VALUE_GET_OBJ(func_obj);
    JSAsyncFunctionData *s = p->u.async_function_data;
    BOOL is_reject = p->class_id - JS_CLASS_ASYNC_FUNCTION_RESOLVE;
    JSValueConst arg;

    if (argc > 0)
        arg = argv[0];
    else
        arg = JS_UNDEFINED;
    s->func_state.throw_flag = is_reject;
    if (is_reject) {
        JS_Throw(ctx, JS_DupValue(ctx, arg));
    } else {
        /* return value of await */
        s->func_state.frame.cur_sp[-1] = JS_DupValue(ctx, arg);
    }
    js_async_function_resume(ctx, s);
    return JS_UNDEFINED;
}